

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_matrix.h
# Opt level: O3

void __thiscall
xray_re::_matrix<double>::get_hpb(_matrix<double> *this,double *h,double *p,double *b)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (this->field_0).field_0._12;
  dVar2 = (this->field_0).field_0._22;
  dVar1 = SQRT(dVar1 * dVar1 + dVar2 * dVar2);
  if (dVar1 <= 3.552713678800501e-15) {
    dVar2 = atan2(-(this->field_0).field_0._13,(this->field_0).field_0._11);
    *h = -dVar2;
    dVar1 = atan2(-(this->field_0).field_0._32,dVar1);
    *p = -dVar1;
    dVar1 = 0.0;
  }
  else {
    dVar2 = atan2((this->field_0).field_0._31,(this->field_0).field_0._33);
    *h = -dVar2;
    dVar1 = atan2(-(this->field_0).field_0._32,dVar1);
    *p = -dVar1;
    dVar1 = atan2((this->field_0).field_0._12,(this->field_0).field_0._22);
    dVar1 = -dVar1;
  }
  *b = dVar1;
  return;
}

Assistant:

void _matrix<T>::get_hpb(T& h, T& p, T& b) const
{
	T cy = std::sqrt(_12*_12 + _22*_22);
	if (cy > 16*xr_numeric_limits<T>::epsilon()) {
		h = -std::atan2(_31, _33);
		p = -std::atan2(-_32, cy);
		b = -std::atan2(_12, _22);
	} else {
		h = -std::atan2(-_13, _11);
		p = -std::atan2(-_32, cy);
		b = 0;
	}
}